

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O3

int run_test_tcp_create_early_bad_domain(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 unaff_RBX;
  char *pcVar4;
  uv_tcp_t client;
  undefined1 auStack_370 [16];
  undefined1 auStack_360 [248];
  char acStack_268 [248];
  char acStack_170 [96];
  code *pcStack_110;
  undefined1 local_100 [248];
  
  pcStack_110 = (code *)0x172926;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x172938;
  iVar1 = uv_tcp_init_ex(uVar2,local_100,0x2f);
  if (iVar1 == -0x16) {
    pcStack_110 = (code *)0x172942;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x172954;
    iVar1 = uv_tcp_init_ex(uVar2,local_100,0x400);
    if (iVar1 != -0x16) goto LAB_001729ac;
    pcStack_110 = (code *)0x17295e;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x172968;
    uv_run(uVar2,0);
    pcStack_110 = (code *)0x17296d;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x172981;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x17298b;
    uv_run(unaff_RBX,0);
    pcStack_110 = (code *)0x172990;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x172998;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1729ac;
    run_test_tcp_create_early_bad_domain_cold_1();
LAB_001729ac:
    pcStack_110 = (code *)0x1729b1;
    run_test_tcp_create_early_bad_domain_cold_2();
  }
  pcStack_110 = run_test_tcp_create_early_accept;
  run_test_tcp_create_early_bad_domain_cold_3();
  pcStack_110 = (code *)unaff_RBX;
  pcVar3 = (char *)uv_default_loop();
  pcVar4 = "0.0.0.0";
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_360);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(pcVar3,acStack_268);
    pcVar4 = pcVar3;
    if (iVar1 != 0) goto LAB_00172ae5;
    pcVar4 = acStack_268;
    iVar1 = uv_tcp_bind(pcVar4,auStack_360,0);
    if (iVar1 != 0) goto LAB_00172aea;
    pcVar4 = acStack_268;
    iVar1 = uv_listen(pcVar4,0x80,on_connection);
    if (iVar1 != 0) goto LAB_00172aef;
    pcVar3 = (char *)uv_default_loop();
    pcVar4 = "127.0.0.1";
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_370);
    if (iVar1 != 0) goto LAB_00172af4;
    iVar1 = uv_tcp_init(pcVar3,auStack_360);
    if (iVar1 != 0) goto LAB_00172af9;
    pcVar3 = acStack_170;
    iVar1 = uv_tcp_connect(pcVar3,auStack_360,auStack_370,on_connect);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00172b03;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_00172ae5:
    run_test_tcp_create_early_accept_cold_2();
LAB_00172aea:
    run_test_tcp_create_early_accept_cold_3();
LAB_00172aef:
    run_test_tcp_create_early_accept_cold_4();
LAB_00172af4:
    pcVar3 = pcVar4;
    run_test_tcp_create_early_accept_cold_5();
LAB_00172af9:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_00172b03:
  run_test_tcp_create_early_accept_cold_8();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_domain) {
  uv_tcp_t client;
  int r;

  r = uv_tcp_init_ex(uv_default_loop(), &client, 47);
  ASSERT(r == UV_EINVAL);

  r = uv_tcp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT(r == UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}